

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_cast(ggml_context *ctx,ggml_tensor *a,ggml_type type)

{
  ggml_tensor *tensor;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int in_stack_ffffffffffffffd8;
  ggml_type in_stack_ffffffffffffffdc;
  ggml_context *in_stack_ffffffffffffffe0;
  
  tensor = ggml_new_tensor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                           in_stack_ffffffffffffffd8,(int64_t *)0x14d89e);
  ggml_format_name(tensor,"%s (copy)",in_RSI->name);
  tensor->op = GGML_OP_CPY;
  tensor->src[0] = in_RSI;
  tensor->src[1] = tensor;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_cast(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum   ggml_type      type) {
    struct ggml_tensor * result = ggml_new_tensor(ctx, type, GGML_MAX_DIMS, a->ne);
    ggml_format_name(result, "%s (copy)", a->name);

    result->op     = GGML_OP_CPY;
    result->src[0] = a;
    result->src[1] = result;

    return result;
}